

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O1

attack * attacktype_fordmg(permonst *ptr,int atyp,int dtyp)

{
  attack *paVar1;
  ulong uVar2;
  
  paVar1 = ptr->mattk;
  uVar2 = 0xc;
  do {
    if ((uint)paVar1->aatyp == atyp) {
      if (dtyp == -1) {
        return paVar1;
      }
      if ((uint)paVar1->adtyp == dtyp) {
        return paVar1;
      }
    }
    paVar1 = paVar1 + 1;
    uVar2 = uVar2 + 4;
    if (0x23 < uVar2) {
      return (attack *)0x0;
    }
  } while( true );
}

Assistant:

const struct attack *attacktype_fordmg(const struct permonst *ptr, int atyp, int dtyp)
{
    const struct attack *a;

    for (a = &ptr->mattk[0]; a < &ptr->mattk[NATTK]; a++)
	if (a->aatyp == atyp && (dtyp == AD_ANY || a->adtyp == dtyp))
	    return a;

    return NULL;
}